

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLargeDataWindowOffsets.cpp
# Opt level: O0

bool anon_unknown.dwarf_134742::compare
               (FrameBuffer *asRead,FrameBuffer *asWritten,Box2i *dataWindow)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint16_t uVar5;
  Slice *pSVar6;
  ostream *poVar7;
  char *pcVar8;
  void *this;
  int *in_RDX;
  long lVar9;
  long lVar10;
  long lVar11;
  char *in_RSI;
  char *ptr_1;
  intptr_t base_1;
  half writtenHalf;
  half readHalf;
  char *ptr;
  intptr_t base;
  int x;
  int y;
  ConstIterator p;
  ConstIterator i;
  ConstIterator *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  uint16_t local_6e;
  uint16_t local_6a;
  half local_50;
  uint16_t local_4e;
  uint16_t local_4c;
  half local_4a;
  uint16_t *local_48;
  long local_40;
  int local_38;
  int local_34;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  int *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = Imf_3_2::FrameBuffer::begin();
  do {
    local_28 = Imf_3_2::FrameBuffer::end();
    bVar4 = Imf_3_2::operator!=((ConstIterator *)
                                CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                in_stack_ffffffffffffff28);
    pcVar8 = local_10;
    if (!bVar4) {
      return true;
    }
    Imf_3_2::FrameBuffer::ConstIterator::name((ConstIterator *)0x1ce7f1);
    local_30 = Imf_3_2::FrameBuffer::find(pcVar8);
    for (local_34 = local_18[1]; local_34 <= local_18[3]; local_34 = local_34 + 1) {
      for (local_38 = *local_18; local_38 <= local_18[2]; local_38 = local_38 + 1) {
        pSVar6 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x1ce86b);
        lVar2 = *(long *)(pSVar6 + 8);
        local_40 = lVar2;
        pSVar6 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x1ce88e);
        lVar3 = *(long *)(pSVar6 + 0x18);
        lVar9 = (long)local_34;
        pSVar6 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x1ce8b8);
        local_48 = (uint16_t *)(lVar2 + lVar3 * lVar9 + *(long *)(pSVar6 + 0x10) * (long)local_38);
        pSVar6 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x1ce8e5);
        iVar1 = *(int *)pSVar6;
        if (iVar1 != 0) {
          if (iVar1 == 1) {
            local_4e = *local_48;
            local_4a._h = local_4e;
          }
          else {
            if (iVar1 != 2) {
              std::operator<<((ostream *)&std::cout,"don\'t know about that\n");
              exit(1);
            }
            Imath_3_2::half::half
                      ((half *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (float)((ulong)in_stack_ffffffffffffff28 >> 0x20));
            local_4a._h = local_4c;
          }
          Imf_3_2::FrameBuffer::end();
          bVar4 = Imf_3_2::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                      in_stack_ffffffffffffff28);
          if (bVar4) {
            pSVar6 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x1ce9be);
            lVar2 = *(long *)(pSVar6 + 8);
            pSVar6 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x1ce9db);
            lVar3 = *(long *)(pSVar6 + 0x18);
            lVar10 = (long)local_34;
            pSVar6 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x1cea05);
            lVar9 = *(long *)(pSVar6 + 0x10);
            lVar11 = (long)local_38;
            pSVar6 = Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x1cea2f);
            iVar1 = *(int *)pSVar6;
            if (iVar1 == 0) goto LAB_001cebea;
            if (iVar1 == 1) {
              local_50._h = *(uint16_t *)(lVar2 + lVar3 * lVar10 + lVar9 * lVar11);
            }
            else {
              if (iVar1 != 2) {
                std::operator<<((ostream *)&std::cout,"don\'t know about that\n");
                exit(1);
              }
              Imath_3_2::half::half
                        ((half *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (float)((ulong)in_stack_ffffffffffffff28 >> 0x20));
              local_50._h = local_6a;
            }
          }
          else {
            Imf_3_2::FrameBuffer::ConstIterator::slice((ConstIterator *)0x1ceac0);
            Imath_3_2::half::half
                      ((half *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (float)((ulong)in_stack_ffffffffffffff28 >> 0x20));
            local_50._h = local_6e;
          }
          uVar5 = Imath_3_2::half::bits(&local_50);
          in_stack_ffffffffffffff34 = (uint)uVar5;
          uVar5 = Imath_3_2::half::bits(&local_4a);
          if (in_stack_ffffffffffffff34 != uVar5) {
            poVar7 = std::operator<<((ostream *)&std::cout,"\n\nerror reading back channel ");
            pcVar8 = Imf_3_2::FrameBuffer::ConstIterator::name((ConstIterator *)0x1ceb37);
            poVar7 = std::operator<<(poVar7,pcVar8);
            poVar7 = std::operator<<(poVar7," pixel ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_38);
            poVar7 = std::operator<<(poVar7,',');
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_34);
            poVar7 = std::operator<<(poVar7," got ");
            poVar7 = (ostream *)::operator<<(poVar7,local_4a);
            poVar7 = std::operator<<(poVar7," expected ");
            this = (void *)::operator<<(poVar7,local_50);
            std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
            exit(1);
          }
        }
LAB_001cebea:
      }
    }
    Imf_3_2::FrameBuffer::ConstIterator::operator++(in_stack_ffffffffffffff28,0);
  } while( true );
}

Assistant:

bool
compare (
    const FrameBuffer& asRead,
    const FrameBuffer& asWritten,
    const Box2i&       dataWindow)
{
    for (FrameBuffer::ConstIterator i = asRead.begin (); i != asRead.end ();
         i++)
    {
        FrameBuffer::ConstIterator p = asWritten.find (i.name ());
        for (int y = dataWindow.min.y; y <= dataWindow.max.y; y++)
        {
            for (int x = dataWindow.min.x; x <= dataWindow.max.x; x++)

            {
                //
                // extract value read back from file
                //
                intptr_t base = reinterpret_cast<intptr_t> (i.slice ().base);
                char*    ptr  = reinterpret_cast<char*> (
                    base + i.slice ().yStride * intptr_t (y) +
                    i.slice ().xStride * intptr_t (x));
                half readHalf;
                switch (i.slice ().type)
                {
                    case IMF::FLOAT: readHalf = half (*(float*) ptr); break;
                    case IMF::HALF: readHalf = half (*(half*) ptr); break;
                    case IMF::UINT: continue; // can't very well check this
                    default: cout << "don't know about that\n"; exit (1);
                }

                //
                // extract value written to file
                //

                half writtenHalf;

                if (p != asWritten.end ())
                {
                    intptr_t base =
                        reinterpret_cast<intptr_t> (p.slice ().base);
                    char* ptr = reinterpret_cast<char*> (
                        base + p.slice ().yStride * intptr_t (y) +
                        p.slice ().xStride * intptr_t (x));
                    switch (p.slice ().type)
                    {
                        case IMF::FLOAT:
                            writtenHalf = half (*(float*) ptr);
                            break;
                        case IMF::HALF:
                            writtenHalf = half (*(half*) ptr);
                            break;
                        case IMF::UINT: continue;
                        default: cout << "don't know about that\n"; exit (1);
                    }
                }
                else
                {
                    writtenHalf = half (i.slice ().fillValue);
                }

                if (writtenHalf.bits () != readHalf.bits ())
                {
                    cout << "\n\nerror reading back channel " << i.name ()
                         << " pixel " << x << ',' << y << " got " << readHalf
                         << " expected " << writtenHalf << endl;
                    assert (writtenHalf.bits () == readHalf.bits ());
                    exit (1);
                }
            }
        }
    }
    return true;
}